

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk_algorithms.cc
# Opt level: O1

void __thiscall topk_algorithms::TopK::sort(TopK *this)

{
  KeyValue *pKVar1;
  KeyValue *pKVar2;
  __normal_iterator<rank::KeyValue_*,_std::vector<rank::KeyValue,_std::allocator<rank::KeyValue>_>_>
  __first;
  __normal_iterator<rank::KeyValue_*,_std::vector<rank::KeyValue,_std::allocator<rank::KeyValue>_>_>
  __last;
  Key KVar3;
  ulong uVar4;
  long lVar5;
  Value VVar6;
  KeyValue *pKVar7;
  ulong uVar8;
  __normal_iterator<rank::KeyValue_*,_std::vector<rank::KeyValue,_std::allocator<rank::KeyValue>_>_>
  _Var9;
  __normal_iterator<rank::KeyValue_*,_std::vector<rank::KeyValue,_std::allocator<rank::KeyValue>_>_>
  __i;
  KeyValue *pKVar10;
  size_t __n;
  
  __first._M_current =
       (this->_entries).super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (this->_entries).super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar8 = (long)__last._M_current - (long)__first._M_current >> 4;
    lVar5 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<rank::KeyValue*,std::vector<rank::KeyValue,std::allocator<rank::KeyValue>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(rank::KeyValue_const&,rank::KeyValue_const&)>>
              (__first,__last,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_rank::KeyValue_&,_const_rank::KeyValue_&)>)0x10ccb5);
    _Var9._M_current = __first._M_current;
    if ((long)__last._M_current - (long)__first._M_current < 0x101) {
      while (pKVar10 = _Var9._M_current + 1, pKVar10 != __last._M_current) {
        uVar8 = pKVar10->_value;
        if (uVar8 < (__first._M_current)->_value) {
          KVar3 = pKVar10->_key;
          VVar6 = pKVar10->_value;
          memmove((void *)((long)_Var9._M_current +
                          (0x20 - ((long)pKVar10 - (long)__first._M_current))),__first._M_current,
                  (long)pKVar10 - (long)__first._M_current);
          (__first._M_current)->_key = KVar3;
          (__first._M_current)->_value = VVar6;
          _Var9._M_current = pKVar10;
        }
        else {
          KVar3 = pKVar10->_key;
          uVar4 = (_Var9._M_current)->_value;
          pKVar2 = pKVar10;
          while (uVar8 < uVar4) {
            VVar6 = pKVar2[-1]._value;
            pKVar2->_key = pKVar2[-1]._key;
            pKVar2->_value = VVar6;
            uVar4 = pKVar2[-2]._value;
            pKVar2 = pKVar2 + -1;
          }
          pKVar2->_key = KVar3;
          pKVar2->_value = uVar8;
          _Var9._M_current = pKVar10;
        }
      }
    }
    else {
      __n = 0x10;
      pKVar10 = __first._M_current + 1;
      do {
        pKVar2 = (KeyValue *)((long)&(__first._M_current)->_key + __n);
        uVar8 = *(ulong *)((long)&(__first._M_current)->_value + __n);
        if (uVar8 < (__first._M_current)->_value) {
          KVar3 = pKVar2->_key;
          VVar6 = pKVar2->_value;
          memmove(__first._M_current + 1,__first._M_current,__n);
          (__first._M_current)->_key = KVar3;
          (__first._M_current)->_value = VVar6;
        }
        else {
          KVar3 = pKVar2->_key;
          uVar4 = (_Var9._M_current)->_value;
          pKVar1 = pKVar2;
          pKVar7 = pKVar10;
          while (uVar8 < uVar4) {
            pKVar1 = pKVar7 + -1;
            VVar6 = pKVar7[-1]._value;
            pKVar7->_key = pKVar7[-1]._key;
            pKVar7->_value = VVar6;
            uVar4 = pKVar7[-2]._value;
            pKVar7 = pKVar1;
          }
          pKVar1->_key = KVar3;
          pKVar1->_value = uVar8;
        }
        __n = __n + 0x10;
        pKVar10 = pKVar10 + 1;
        _Var9._M_current = pKVar2;
      } while (__n != 0x100);
      for (pKVar10 = __first._M_current + 0x10; pKVar10 != __last._M_current; pKVar10 = pKVar10 + 1)
      {
        KVar3 = pKVar10->_key;
        uVar8 = pKVar10->_value;
        uVar4 = pKVar10[-1]._value;
        pKVar2 = pKVar10;
        while (uVar8 < uVar4) {
          VVar6 = pKVar2[-1]._value;
          pKVar2->_key = pKVar2[-1]._key;
          pKVar2->_value = VVar6;
          uVar4 = pKVar2[-2]._value;
          pKVar2 = pKVar2 + -1;
        }
        pKVar2->_key = KVar3;
        pKVar2->_value = uVar8;
      }
    }
  }
  return;
}

Assistant:

void TopK::sort() {
        std::sort(_entries.begin(), _entries.end(), topk_sort_cmp);
    }